

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  RTCRayQueryFlags RVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  RTCIntersectArguments *pRVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [24];
  undefined1 auVar38 [24];
  undefined1 auVar39 [24];
  RTCIntersectArguments *pRVar40;
  bool bVar41;
  int iVar42;
  long lVar43;
  undefined4 uVar44;
  RTCIntersectArguments *pRVar45;
  ulong uVar46;
  ulong uVar47;
  NodeRef root;
  long lVar48;
  undefined1 (*pauVar49) [32];
  size_t *psVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  uint uVar83;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined4 uVar93;
  undefined1 auVar87 [64];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d29;
  RayK<8> *local_5d28;
  BVH *local_5d20;
  Intersectors *local_5d18;
  RayQueryContext *local_5d10;
  RayK<8> *local_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  uint local_5c80;
  undefined4 uStack_5c7c;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined1 local_5c60 [32];
  size_t local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined1 local_5ba0 [32];
  undefined4 local_5b80;
  undefined4 uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d20 = (BVH *)This->ptr;
  local_5808[0] = (local_5d20->root).ptr;
  if (local_5808[0] != 8) {
    pRVar45 = (RTCIntersectArguments *)ray;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       (pRVar45 = context->args,
       (pRVar45->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar64 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar56 = ZEXT816(0) << 0x40;
      auVar66 = vpcmpeqd_avx2(auVar64,(undefined1  [32])valid_i->field_0);
      auVar64 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar56),5);
      auVar57 = auVar66 & auVar64;
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0x7f,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar57 >> 0xbf,0) != '\0') ||
          (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar57[0x1f] < '\0') {
        auVar64 = vandps_avx(auVar64,auVar66);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c20._8_4_ = 0x7fffffff;
        local_5c20._0_8_ = 0x7fffffff7fffffff;
        local_5c20._12_4_ = 0x7fffffff;
        local_5c20._16_4_ = 0x7fffffff;
        local_5c20._20_4_ = 0x7fffffff;
        local_5c20._24_4_ = 0x7fffffff;
        local_5c20._28_4_ = 0x7fffffff;
        auVar84._8_4_ = 0x219392ef;
        auVar84._0_8_ = 0x219392ef219392ef;
        auVar84._12_4_ = 0x219392ef;
        auVar84._16_4_ = 0x219392ef;
        auVar84._20_4_ = 0x219392ef;
        auVar84._24_4_ = 0x219392ef;
        auVar84._28_4_ = 0x219392ef;
        auVar57 = vandps_avx(local_5c20,local_59e0);
        auVar57 = vcmpps_avx(auVar57,auVar84,1);
        auVar66 = vblendvps_avx(local_59e0,auVar84,auVar57);
        auVar57 = vandps_avx(local_5c20,local_59c0);
        auVar57 = vcmpps_avx(auVar57,auVar84,1);
        auVar67 = vblendvps_avx(local_59c0,auVar84,auVar57);
        auVar57 = vandps_avx(local_59a0,local_5c20);
        auVar57 = vcmpps_avx(auVar57,auVar84,1);
        auVar57 = vblendvps_avx(local_59a0,auVar84,auVar57);
        auVar13 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
        auVar64 = vrcpps_avx(auVar66);
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = 0x3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar80._16_4_ = 0x3f800000;
        auVar80._20_4_ = 0x3f800000;
        auVar80._24_4_ = 0x3f800000;
        auVar80._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar66,auVar64,auVar80);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar64,auVar64);
        auVar64 = vrcpps_avx(auVar67);
        auVar18 = vfnmadd213ps_fma(auVar67,auVar64,auVar80);
        auVar66 = vrcpps_avx(auVar57);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar64,auVar64);
        auVar19 = vfnmadd213ps_fma(auVar57,auVar66,auVar80);
        auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar66,auVar66);
        local_5980 = ZEXT1632(auVar17);
        local_5960 = ZEXT1632(auVar18);
        local_5940 = ZEXT1632(auVar19);
        local_5920 = auVar17._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar17._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar17._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar17._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar18._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar18._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar18._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar18._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar19._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar19._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar19._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar19._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar64 = vcmpps_avx(local_5980,ZEXT1632(auVar56),1);
        auVar66._8_4_ = 0x20;
        auVar66._0_8_ = 0x2000000020;
        auVar66._12_4_ = 0x20;
        auVar66._16_4_ = 0x20;
        auVar66._20_4_ = 0x20;
        auVar66._24_4_ = 0x20;
        auVar66._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar64,auVar66);
        auVar57 = ZEXT1632(auVar56);
        auVar64 = vcmpps_avx(ZEXT1632(auVar18),auVar57,5);
        auVar67._8_4_ = 0x40;
        auVar67._0_8_ = 0x4000000040;
        auVar67._12_4_ = 0x40;
        auVar67._16_4_ = 0x40;
        auVar67._20_4_ = 0x40;
        auVar67._24_4_ = 0x40;
        auVar67._28_4_ = 0x40;
        auVar72._8_4_ = 0x60;
        auVar72._0_8_ = 0x6000000060;
        auVar72._12_4_ = 0x60;
        auVar72._16_4_ = 0x60;
        auVar72._20_4_ = 0x60;
        auVar72._24_4_ = 0x60;
        auVar72._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar72,auVar67,auVar64);
        auVar64 = vcmpps_avx(ZEXT1632(auVar19),auVar57,5);
        auVar68._8_4_ = 0x80;
        auVar68._0_8_ = 0x8000000080;
        auVar68._12_4_ = 0x80;
        auVar68._16_4_ = 0x80;
        auVar68._20_4_ = 0x80;
        auVar68._24_4_ = 0x80;
        auVar68._28_4_ = 0x80;
        auVar73._8_4_ = 0xa0;
        auVar73._0_8_ = 0xa0000000a0;
        auVar73._12_4_ = 0xa0;
        auVar73._16_4_ = 0xa0;
        auVar73._20_4_ = 0xa0;
        auVar73._24_4_ = 0xa0;
        auVar73._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar73,auVar68,auVar64);
        auVar64 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar57);
        local_5c00 = vpmovsxwd_avx2(auVar13);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar82 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar64,local_5c00);
        auVar64 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar57);
        auVar57._8_4_ = 0xff800000;
        auVar57._0_8_ = 0xff800000ff800000;
        auVar57._12_4_ = 0xff800000;
        auVar57._16_4_ = 0xff800000;
        auVar57._20_4_ = 0xff800000;
        auVar57._24_4_ = 0xff800000;
        auVar57._28_4_ = 0xff800000;
        auVar61 = ZEXT3264(auVar57);
        local_5840 = vblendvps_avx(auVar57,auVar64,local_5c00);
        auVar56 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5cc0 = vpmovsxwd_avx2(auVar13 ^ auVar56);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar47 = 7;
        }
        else {
          pRVar45 = (RTCIntersectArguments *)
                    (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT);
          uVar47 = (long)pRVar45 * 5 + 2;
        }
        local_5d08 = ray + 0x100;
        psVar50 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar49 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        local_5d00 = mm_lookupmask_ps._16_8_;
        uStack_5cf8 = mm_lookupmask_ps._24_8_;
        uStack_5cf0 = mm_lookupmask_ps._16_8_;
        uStack_5ce8 = mm_lookupmask_ps._24_8_;
        local_5d18 = This;
        local_5d28 = ray;
        local_5d10 = context;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_01699367:
        do {
          do {
            root.ptr = psVar50[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01699a53;
            psVar50 = psVar50 + -1;
            pauVar49 = pauVar49 + -1;
            local_5c60 = *pauVar49;
            auVar87 = ZEXT3264(local_5c60);
            auVar64 = vcmpps_avx(local_5c60,local_5840,1);
          } while ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar64 >> 0x7f,0) == '\0') &&
                     (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar64 >> 0xbf,0) == '\0') &&
                   (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar64[0x1f]);
          uVar44 = vmovmskps_avx(auVar64);
          pRVar45 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar45 >> 0x20),uVar44);
          local_5c80 = POPCOUNT(uVar44);
          if (uVar47 < local_5c80) {
LAB_016993a4:
            do {
              if ((root.ptr & 8) != 0) {
                if ((RTCIntersectArguments *)root.ptr ==
                    (RTCIntersectArguments *)&DAT_fffffffffffffff8) goto LAB_01699a53;
                local_5ba0 = local_5840;
                auVar64 = vcmpps_avx(local_5840,auVar87._0_32_,6);
                if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar64 >> 0x7f,0) == '\0') &&
                      (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar64 >> 0xbf,0) == '\0') &&
                    (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar64[0x1f]) goto LAB_01699367;
                local_5b80 = local_5cc0._0_4_;
                uStack_5b7c = local_5cc0._4_4_;
                uStack_5b78 = local_5cc0._8_4_;
                uStack_5b74 = local_5cc0._12_4_;
                uStack_5b70 = local_5cc0._16_4_;
                uStack_5b6c = local_5cc0._20_4_;
                uStack_5b68 = local_5cc0._24_4_;
                uStack_5b64 = local_5cc0._28_4_;
                local_5ca0._0_8_ = local_5cc0._0_8_ ^ 0xffffffffffffffff;
                local_5ca0._8_4_ = local_5cc0._8_4_ ^ 0xffffffff;
                local_5ca0._12_4_ = local_5cc0._12_4_ ^ 0xffffffff;
                local_5ca0._16_4_ = local_5cc0._16_4_ ^ 0xffffffff;
                local_5ca0._20_4_ = local_5cc0._20_4_ ^ 0xffffffff;
                local_5ca0._24_4_ = local_5cc0._24_4_ ^ 0xffffffff;
                local_5ca0._28_4_ = local_5cc0._28_4_ ^ 0xffffffff;
                uStack_5c38 = *(undefined8 *)(local_5d28 + 8);
                uStack_5c30 = *(undefined8 *)(local_5d28 + 0x10);
                uStack_5c28 = *(undefined8 *)(local_5d28 + 0x18);
                uStack_5c78 = *(undefined8 *)(local_5d28 + 0x48);
                uStack_5c70 = *(undefined8 *)(local_5d28 + 0x50);
                uStack_5c68 = *(undefined8 *)(local_5d28 + 0x58);
                uVar28 = *(undefined8 *)(local_5d28 + 0x60);
                uVar29 = *(undefined8 *)(local_5d28 + 0x68);
                uVar30 = *(undefined8 *)(local_5d28 + 0x70);
                uStack_5ba8 = *(undefined8 *)(local_5d28 + 0x78);
                pRVar1 = local_5d28 + 0xa0;
                local_5a60 = *(undefined8 *)pRVar1;
                uStack_5a58 = *(undefined8 *)(local_5d28 + 0xa8);
                uStack_5a50 = *(undefined8 *)(local_5d28 + 0xb0);
                auVar37 = *(undefined1 (*) [24])pRVar1;
                uStack_5a48 = *(undefined8 *)(local_5d28 + 0xb8);
                pRVar2 = local_5d28 + 0xc0;
                local_5a80 = *(undefined8 *)pRVar2;
                uStack_5a78 = *(undefined8 *)(local_5d28 + 200);
                uStack_5a70 = *(undefined8 *)(local_5d28 + 0xd0);
                auVar38 = *(undefined1 (*) [24])pRVar2;
                uStack_5a68 = *(undefined8 *)(local_5d28 + 0xd8);
                pRVar3 = local_5d28 + 0x80;
                local_5aa0 = *(undefined8 *)pRVar3;
                uStack_5a98 = *(undefined8 *)(local_5d28 + 0x88);
                uStack_5a90 = *(undefined8 *)(local_5d28 + 0x90);
                auVar39 = *(undefined1 (*) [24])pRVar3;
                uStack_5a88 = *(undefined8 *)(local_5d28 + 0x98);
                uVar31 = *(undefined8 *)(local_5d28 + 0x100);
                uVar32 = *(undefined8 *)(local_5d28 + 0x108);
                uVar33 = *(undefined8 *)(local_5d28 + 0x110);
                uStack_5bc8 = *(undefined8 *)(local_5d28 + 0x118);
                local_5ac0 = *(undefined8 *)(local_5d28 + 0x120);
                uStack_5ab8 = *(undefined8 *)(local_5d28 + 0x128);
                uStack_5ab0 = *(undefined8 *)(local_5d28 + 0x130);
                uStack_5aa8 = *(undefined8 *)(local_5d28 + 0x138);
                lVar48 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                lVar43 = 0;
                goto LAB_0169962d;
              }
              pRVar45 = (RTCIntersectArguments *)0x8;
              auVar64 = auVar82._0_32_;
              for (lVar43 = 0;
                  (auVar87 = ZEXT3264(auVar64), lVar43 != 8 &&
                  (pRVar11 = *(RTCIntersectArguments **)
                              ((root.ptr & 0xfffffffffffffff0) + lVar43 * 8),
                  pRVar11 != (RTCIntersectArguments *)0x8)); lVar43 = lVar43 + 1) {
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0x40))->flags)[lVar43];
                auVar58._4_4_ = RVar4;
                auVar58._0_4_ = RVar4;
                auVar58._8_4_ = RVar4;
                auVar58._12_4_ = RVar4;
                auVar58._16_4_ = RVar4;
                auVar58._20_4_ = RVar4;
                auVar58._24_4_ = RVar4;
                auVar58._28_4_ = RVar4;
                auVar34._4_4_ = fStack_591c;
                auVar34._0_4_ = local_5920;
                auVar34._8_4_ = fStack_5918;
                auVar34._12_4_ = fStack_5914;
                auVar34._16_4_ = fStack_5910;
                auVar34._20_4_ = fStack_590c;
                auVar34._24_4_ = fStack_5908;
                auVar34._28_4_ = uStack_5904;
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0x80))->flags)[lVar43];
                auVar74._4_4_ = RVar4;
                auVar74._0_4_ = RVar4;
                auVar74._8_4_ = RVar4;
                auVar74._12_4_ = RVar4;
                auVar74._16_4_ = RVar4;
                auVar74._20_4_ = RVar4;
                auVar74._24_4_ = RVar4;
                auVar74._28_4_ = RVar4;
                auVar56 = vfmsub213ps_fma(auVar58,local_5980,auVar34);
                auVar35._4_4_ = fStack_58fc;
                auVar35._0_4_ = local_5900;
                auVar35._8_4_ = fStack_58f8;
                auVar35._12_4_ = fStack_58f4;
                auVar35._16_4_ = fStack_58f0;
                auVar35._20_4_ = fStack_58ec;
                auVar35._24_4_ = fStack_58e8;
                auVar35._28_4_ = uStack_58e4;
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0xc0))->flags)[lVar43];
                auVar78._4_4_ = RVar4;
                auVar78._0_4_ = RVar4;
                auVar78._8_4_ = RVar4;
                auVar78._12_4_ = RVar4;
                auVar78._16_4_ = RVar4;
                auVar78._20_4_ = RVar4;
                auVar78._24_4_ = RVar4;
                auVar78._28_4_ = RVar4;
                auVar13 = vfmsub213ps_fma(auVar74,local_5960,auVar35);
                auVar36._4_4_ = fStack_58dc;
                auVar36._0_4_ = local_58e0;
                auVar36._8_4_ = fStack_58d8;
                auVar36._12_4_ = fStack_58d4;
                auVar36._16_4_ = fStack_58d0;
                auVar36._20_4_ = fStack_58cc;
                auVar36._24_4_ = fStack_58c8;
                auVar36._28_4_ = uStack_58c4;
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0x60))->flags)[lVar43];
                auVar79._4_4_ = RVar4;
                auVar79._0_4_ = RVar4;
                auVar79._8_4_ = RVar4;
                auVar79._12_4_ = RVar4;
                auVar79._16_4_ = RVar4;
                auVar79._20_4_ = RVar4;
                auVar79._24_4_ = RVar4;
                auVar79._28_4_ = RVar4;
                auVar17 = vfmsub213ps_fma(auVar78,local_5940,auVar36);
                auVar18 = vfmsub213ps_fma(auVar79,local_5980,auVar34);
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0xa0))->flags)[lVar43];
                auVar69._4_4_ = RVar4;
                auVar69._0_4_ = RVar4;
                auVar69._8_4_ = RVar4;
                auVar69._12_4_ = RVar4;
                auVar69._16_4_ = RVar4;
                auVar69._20_4_ = RVar4;
                auVar69._24_4_ = RVar4;
                auVar69._28_4_ = RVar4;
                auVar19 = vfmsub213ps_fma(auVar69,local_5960,auVar35);
                RVar4 = (&((RTCIntersectArguments *)(root.ptr + 0xe0))->flags)[lVar43];
                auVar62._4_4_ = RVar4;
                auVar62._0_4_ = RVar4;
                auVar62._8_4_ = RVar4;
                auVar62._12_4_ = RVar4;
                auVar62._16_4_ = RVar4;
                auVar62._20_4_ = RVar4;
                auVar62._24_4_ = RVar4;
                auVar62._28_4_ = RVar4;
                auVar14 = vfmsub213ps_fma(auVar62,local_5940,auVar36);
                auVar57 = vpminsd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar18));
                auVar66 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar19));
                auVar57 = vpmaxsd_avx2(auVar57,auVar66);
                auVar66 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
                auVar67 = vpmaxsd_avx2(auVar57,auVar66);
                auVar57 = vpmaxsd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar18));
                auVar66 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar19));
                auVar66 = vpminsd_avx2(auVar57,auVar66);
                auVar57 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar14));
                auVar66 = vpminsd_avx2(auVar66,auVar57);
                auVar57 = vpmaxsd_avx2(auVar67,local_5860);
                auVar66 = vpminsd_avx2(auVar66,local_5840);
                auVar66 = vcmpps_avx(auVar57,auVar66,2);
                auVar61 = ZEXT3264(auVar66);
                pRVar40 = pRVar45;
                auVar57 = auVar64;
                if (((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar66 >> 0x7f,0) != '\0') ||
                       (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar66 >> 0xbf,0) != '\0') ||
                     (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar66[0x1f] < '\0') &&
                   (auVar57 = vblendvps_avx(auVar82._0_32_,auVar67,auVar66), pRVar40 = pRVar11,
                   pRVar45 != (RTCIntersectArguments *)0x8)) {
                  *psVar50 = (size_t)pRVar45;
                  psVar50 = psVar50 + 1;
                  *pauVar49 = auVar64;
                  pauVar49 = pauVar49 + 1;
                }
                auVar64 = auVar57;
                pRVar45 = pRVar40;
              }
              if (pRVar45 == (RTCIntersectArguments *)0x8) goto LAB_01699520;
              auVar57 = vcmpps_avx(local_5840,auVar64,6);
              uVar44 = vmovmskps_avx(auVar57);
              root.ptr = (size_t)pRVar45;
            } while ((byte)uVar47 < (byte)POPCOUNT(uVar44));
            *psVar50 = (size_t)pRVar45;
            psVar50 = psVar50 + 1;
            *pauVar49 = auVar64;
            pauVar49 = pauVar49 + 1;
LAB_01699520:
            iVar42 = 4;
          }
          else {
            uStack_5c7c = 0;
            while (pRVar45 != (RTCIntersectArguments *)0x0) {
              local_5c40 = 0;
              for (pRVar11 = pRVar45; ((ulong)pRVar11 & 1) == 0;
                  pRVar11 = (RTCIntersectArguments *)((ulong)pRVar11 >> 1 | 0x8000000000000000)) {
                local_5c40 = local_5c40 + 1;
              }
              local_5ce0._0_8_ = (ulong)((long)&pRVar45[-1].intersect + 7U) & (ulong)pRVar45;
              auVar61 = ZEXT1664(auVar61._0_16_);
              bVar41 = occluded1(local_5d18,local_5d20,root,local_5c40,&local_5d29,local_5d28,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5d10);
              pRVar45 = (RTCIntersectArguments *)local_5ce0._0_8_;
              if (bVar41) {
                *(undefined4 *)(local_5cc0 + local_5c40 * 4) = 0xffffffff;
              }
            }
            auVar64 = _DAT_01f7b020 & ~local_5cc0;
            iVar42 = 3;
            auVar82 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar87 = ZEXT3264(local_5c60);
            if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar64 >> 0x7f,0) != '\0') ||
                  (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar64 >> 0xbf,0) != '\0') ||
                (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar64[0x1f] < '\0') {
              auVar61 = ZEXT3264(local_5840);
              auVar64._8_4_ = 0xff800000;
              auVar64._0_8_ = 0xff800000ff800000;
              auVar64._12_4_ = 0xff800000;
              auVar64._16_4_ = 0xff800000;
              auVar64._20_4_ = 0xff800000;
              auVar64._24_4_ = 0xff800000;
              auVar64._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar64,local_5cc0);
              iVar42 = 2;
            }
            pRVar45 = (RTCIntersectArguments *)0x0;
            if ((uint)uVar47 < local_5c80) goto LAB_016993a4;
            pRVar45 = (RTCIntersectArguments *)0x0;
          }
        } while (iVar42 != 3);
LAB_01699a53:
        auVar64 = vandps_avx(local_5c00,local_5cc0);
        auVar60._8_4_ = 0xff800000;
        auVar60._0_8_ = 0xff800000ff800000;
        auVar60._12_4_ = 0xff800000;
        auVar60._16_4_ = 0xff800000;
        auVar60._20_4_ = 0xff800000;
        auVar60._24_4_ = 0xff800000;
        auVar60._28_4_ = 0xff800000;
        auVar64 = vmaskmovps_avx(auVar64,auVar60);
        *(undefined1 (*) [32])local_5d08 = auVar64;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_0169962d:
  do {
    auVar64 = auVar61._0_32_;
    if (lVar43 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    pRVar45 = (RTCIntersectArguments *)&DAT_fffffffffffffff0;
    auVar57 = local_5ca0;
    do {
      auVar64 = auVar57;
      auVar57 = auVar64;
      if ((pRVar45 == (RTCIntersectArguments *)0x0) ||
         (uVar46 = (ulong)*(uint *)((long)&pRVar45->filter + lVar48), uVar46 == 0xffffffff)) break;
      uVar44 = *(undefined4 *)((long)&pRVar45[-4].flags + lVar48);
      auVar51._4_4_ = uVar44;
      auVar51._0_4_ = uVar44;
      auVar51._8_4_ = uVar44;
      auVar51._12_4_ = uVar44;
      auVar51._16_4_ = uVar44;
      auVar51._20_4_ = uVar44;
      auVar51._24_4_ = uVar44;
      auVar51._28_4_ = uVar44;
      local_5b20 = vsubps_avx(auVar51,*(undefined1 (*) [32])local_5d28);
      uVar44 = *(undefined4 *)(lVar48 + -0x70 + (long)pRVar45);
      auVar52._4_4_ = uVar44;
      auVar52._0_4_ = uVar44;
      auVar52._8_4_ = uVar44;
      auVar52._12_4_ = uVar44;
      auVar52._16_4_ = uVar44;
      auVar52._20_4_ = uVar44;
      auVar52._24_4_ = uVar44;
      auVar52._28_4_ = uVar44;
      local_5b40 = vsubps_avx(auVar52,*(undefined1 (*) [32])(local_5d28 + 0x20));
      uVar44 = *(undefined4 *)((long)&pRVar45[-3].flags + lVar48);
      auVar53._4_4_ = uVar44;
      auVar53._0_4_ = uVar44;
      auVar53._8_4_ = uVar44;
      auVar53._12_4_ = uVar44;
      auVar53._16_4_ = uVar44;
      auVar53._20_4_ = uVar44;
      auVar53._24_4_ = uVar44;
      auVar53._28_4_ = uVar44;
      local_5b60 = vsubps_avx(auVar53,*(undefined1 (*) [32])(local_5d28 + 0x40));
      fVar5 = *(float *)(lVar48 + -0x50 + (long)pRVar45);
      local_5ae0._4_4_ = fVar5;
      local_5ae0._0_4_ = fVar5;
      local_5ae0._8_4_ = fVar5;
      local_5ae0._12_4_ = fVar5;
      local_5ae0._16_4_ = fVar5;
      local_5ae0._20_4_ = fVar5;
      local_5ae0._24_4_ = fVar5;
      local_5ae0._28_4_ = fVar5;
      fVar6 = *(float *)((long)&pRVar45[-2].flags + lVar48);
      local_5b00._4_4_ = fVar6;
      local_5b00._0_4_ = fVar6;
      local_5b00._8_4_ = fVar6;
      local_5b00._12_4_ = fVar6;
      local_5b00._16_4_ = fVar6;
      local_5b00._20_4_ = fVar6;
      local_5b00._24_4_ = fVar6;
      local_5b00._28_4_ = fVar6;
      fVar7 = *(float *)(lVar48 + -0x30 + (long)pRVar45);
      auVar70._4_4_ = fVar7;
      auVar70._0_4_ = fVar7;
      auVar70._8_4_ = fVar7;
      auVar70._12_4_ = fVar7;
      auVar70._16_4_ = fVar7;
      auVar70._20_4_ = fVar7;
      auVar70._24_4_ = fVar7;
      auVar70._28_4_ = fVar7;
      fVar8 = *(float *)((long)&pRVar45[-1].flags + lVar48);
      auVar75._4_4_ = fVar8;
      auVar75._0_4_ = fVar8;
      auVar75._8_4_ = fVar8;
      auVar75._12_4_ = fVar8;
      auVar75._16_4_ = fVar8;
      auVar75._20_4_ = fVar8;
      auVar75._24_4_ = fVar8;
      auVar75._28_4_ = fVar8;
      fVar9 = *(float *)(lVar48 + -0x10 + (long)pRVar45);
      auVar85._4_4_ = fVar9;
      auVar85._0_4_ = fVar9;
      auVar85._8_4_ = fVar9;
      auVar85._12_4_ = fVar9;
      auVar85._16_4_ = fVar9;
      auVar85._20_4_ = fVar9;
      auVar85._24_4_ = fVar9;
      auVar85._28_4_ = fVar9;
      fVar10 = *(float *)((long)&pRVar45->flags + lVar48);
      auVar94._4_4_ = fVar10;
      auVar94._0_4_ = fVar10;
      auVar94._8_4_ = fVar10;
      auVar94._12_4_ = fVar10;
      auVar94._16_4_ = fVar10;
      auVar94._20_4_ = fVar10;
      auVar94._24_4_ = fVar10;
      auVar94._28_4_ = fVar10;
      fVar12 = fVar6 * fVar10;
      auVar77._4_4_ = fVar12;
      auVar77._0_4_ = fVar12;
      auVar77._8_4_ = fVar12;
      auVar77._12_4_ = fVar12;
      auVar77._16_4_ = fVar12;
      auVar77._20_4_ = fVar12;
      auVar77._24_4_ = fVar12;
      auVar77._28_4_ = fVar12;
      auVar17 = vfmsub231ps_fma(auVar77,auVar85,auVar70);
      fVar8 = fVar7 * fVar8;
      auVar81._4_4_ = fVar8;
      auVar81._0_4_ = fVar8;
      auVar81._8_4_ = fVar8;
      auVar81._12_4_ = fVar8;
      auVar81._16_4_ = fVar8;
      auVar81._20_4_ = fVar8;
      auVar81._24_4_ = fVar8;
      auVar81._28_4_ = fVar8;
      auVar18 = vfmsub231ps_fma(auVar81,auVar94,local_5ae0);
      fVar9 = fVar9 * fVar5;
      auVar96._4_4_ = fVar9;
      auVar96._0_4_ = fVar9;
      auVar96._8_4_ = fVar9;
      auVar96._12_4_ = fVar9;
      auVar96._16_4_ = fVar9;
      auVar96._20_4_ = fVar9;
      auVar96._24_4_ = fVar9;
      auVar96._28_4_ = fVar9;
      auVar19 = vfmsub231ps_fma(auVar96,auVar75,local_5b00);
      auVar20._4_4_ = auVar37._4_4_ * local_5b60._4_4_;
      auVar20._0_4_ = auVar37._0_4_ * local_5b60._0_4_;
      auVar20._8_4_ = auVar37._8_4_ * local_5b60._8_4_;
      auVar20._12_4_ = auVar37._12_4_ * local_5b60._12_4_;
      auVar20._16_4_ = auVar37._16_4_ * local_5b60._16_4_;
      auVar20._20_4_ = auVar37._20_4_ * local_5b60._20_4_;
      auVar20._24_4_ = (float)uStack_5a48 * local_5b60._24_4_;
      auVar20._28_4_ = fVar5;
      auVar14 = vfmsub231ps_fma(auVar20,local_5b40,*(undefined1 (*) [32])pRVar2);
      auVar21._4_4_ = auVar38._4_4_ * local_5b20._4_4_;
      auVar21._0_4_ = auVar38._0_4_ * local_5b20._0_4_;
      auVar21._8_4_ = auVar38._8_4_ * local_5b20._8_4_;
      auVar21._12_4_ = auVar38._12_4_ * local_5b20._12_4_;
      auVar21._16_4_ = auVar38._16_4_ * local_5b20._16_4_;
      auVar21._20_4_ = auVar38._20_4_ * local_5b20._20_4_;
      auVar21._24_4_ = (float)uStack_5a68 * local_5b20._24_4_;
      auVar21._28_4_ = fVar6;
      auVar15 = vfmsub231ps_fma(auVar21,local_5b60,*(undefined1 (*) [32])pRVar3);
      auVar22._4_4_ = auVar39._4_4_ * local_5b40._4_4_;
      auVar22._0_4_ = auVar39._0_4_ * local_5b40._0_4_;
      auVar22._8_4_ = auVar39._8_4_ * local_5b40._8_4_;
      auVar22._12_4_ = auVar39._12_4_ * local_5b40._12_4_;
      auVar22._16_4_ = auVar39._16_4_ * local_5b40._16_4_;
      auVar22._20_4_ = auVar39._20_4_ * local_5b40._20_4_;
      auVar22._24_4_ = (float)uStack_5a88 * local_5b40._24_4_;
      auVar22._28_4_ = local_5b40._28_4_;
      auVar16 = vfmsub231ps_fma(auVar22,local_5b20,*(undefined1 (*) [32])pRVar1);
      auVar23._4_4_ = auVar19._4_4_ * auVar38._4_4_;
      auVar23._0_4_ = auVar19._0_4_ * auVar38._0_4_;
      auVar23._8_4_ = auVar19._8_4_ * auVar38._8_4_;
      auVar23._12_4_ = auVar19._12_4_ * auVar38._12_4_;
      auVar23._16_4_ = auVar38._16_4_ * 0.0;
      auVar23._20_4_ = auVar38._20_4_ * 0.0;
      auVar23._24_4_ = (float)uStack_5a68 * 0.0;
      auVar23._28_4_ = (int)((ulong)uStack_5a68 >> 0x20);
      auVar56 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar18),*(undefined1 (*) [32])pRVar1);
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar17),*(undefined1 (*) [32])pRVar3);
      auVar24._4_4_ = fVar10 * auVar16._4_4_;
      auVar24._0_4_ = fVar10 * auVar16._0_4_;
      auVar24._8_4_ = fVar10 * auVar16._8_4_;
      auVar24._12_4_ = fVar10 * auVar16._12_4_;
      auVar24._16_4_ = fVar10 * 0.0;
      auVar24._20_4_ = fVar10 * 0.0;
      auVar24._24_4_ = fVar10 * 0.0;
      auVar24._28_4_ = fVar10;
      auVar13 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar15),auVar85);
      auVar86._8_4_ = 0x80000000;
      auVar86._0_8_ = 0x8000000080000000;
      auVar86._12_4_ = 0x80000000;
      auVar86._16_4_ = 0x80000000;
      auVar86._20_4_ = 0x80000000;
      auVar86._24_4_ = 0x80000000;
      auVar86._28_4_ = 0x80000000;
      auVar66 = vandps_avx(auVar86,ZEXT1632(auVar56));
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar14),auVar75);
      uVar83 = auVar66._0_4_;
      auVar95._0_4_ = uVar83 ^ auVar13._0_4_;
      uVar88 = auVar66._4_4_;
      auVar95._4_4_ = uVar88 ^ auVar13._4_4_;
      uVar89 = auVar66._8_4_;
      auVar95._8_4_ = uVar89 ^ auVar13._8_4_;
      uVar90 = auVar66._12_4_;
      auVar95._12_4_ = uVar90 ^ auVar13._12_4_;
      uVar44 = auVar66._16_4_;
      auVar95._16_4_ = uVar44;
      uVar91 = auVar66._20_4_;
      auVar95._20_4_ = uVar91;
      uVar92 = auVar66._24_4_;
      auVar95._24_4_ = uVar92;
      uVar93 = auVar66._28_4_;
      auVar95._28_4_ = uVar93;
      auVar66 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
      auVar67 = auVar64 & auVar66;
      auVar76._8_8_ = uStack_5cf8;
      auVar76._0_8_ = local_5d00;
      auVar76._16_8_ = uStack_5cf0;
      auVar76._24_8_ = uStack_5ce8;
      if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar67 >> 0x7f,0) != '\0') ||
            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar67 >> 0xbf,0) != '\0') ||
          (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar67[0x1f] < '\0') {
        auVar66 = vandps_avx(auVar66,auVar64);
        auVar25._4_4_ = auVar16._4_4_ * fVar7;
        auVar25._0_4_ = auVar16._0_4_ * fVar7;
        auVar25._8_4_ = auVar16._8_4_ * fVar7;
        auVar25._12_4_ = auVar16._12_4_ * fVar7;
        auVar25._16_4_ = fVar7 * 0.0;
        auVar25._20_4_ = fVar7 * 0.0;
        auVar25._24_4_ = fVar7 * 0.0;
        auVar25._28_4_ = fVar7;
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar25,local_5b00);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),local_5ae0);
        auVar65._0_4_ = uVar83 ^ auVar13._0_4_;
        auVar65._4_4_ = uVar88 ^ auVar13._4_4_;
        auVar65._8_4_ = uVar89 ^ auVar13._8_4_;
        auVar65._12_4_ = uVar90 ^ auVar13._12_4_;
        auVar65._16_4_ = uVar44;
        auVar65._20_4_ = uVar91;
        auVar65._24_4_ = uVar92;
        auVar65._28_4_ = uVar93;
        auVar67 = vcmpps_avx(auVar65,ZEXT832(0) << 0x20,5);
        auVar68 = auVar66 & auVar67;
        if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar68 >> 0x7f,0) != '\0') ||
              (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar68 >> 0xbf,0) != '\0') ||
            (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar68[0x1f] < '\0') {
          auVar68 = vandps_avx(ZEXT1632(auVar56),local_5c20);
          auVar67 = vandps_avx(auVar67,auVar66);
          auVar72 = vsubps_avx(auVar68,auVar95);
          auVar72 = vcmpps_avx(auVar72,auVar65,5);
          auVar73 = auVar67 & auVar72;
          if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0x7f,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar73 >> 0xbf,0) != '\0') ||
              (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar73[0x1f] < '\0') {
            auVar67 = vandps_avx(auVar72,auVar67);
            auVar26._4_4_ = auVar19._4_4_ * local_5b60._4_4_;
            auVar26._0_4_ = auVar19._0_4_ * local_5b60._0_4_;
            auVar26._8_4_ = auVar19._8_4_ * local_5b60._8_4_;
            auVar26._12_4_ = auVar19._12_4_ * local_5b60._12_4_;
            auVar26._16_4_ = local_5b60._16_4_ * 0.0;
            auVar26._20_4_ = local_5b60._20_4_ * 0.0;
            auVar26._24_4_ = local_5b60._24_4_ * 0.0;
            auVar26._28_4_ = auVar66._28_4_;
            auVar13 = vfmadd213ps_fma(local_5b40,ZEXT1632(auVar18),auVar26);
            auVar13 = vfmadd213ps_fma(local_5b20,ZEXT1632(auVar17),ZEXT1632(auVar13));
            auVar63._0_4_ = uVar83 ^ auVar13._0_4_;
            auVar63._4_4_ = uVar88 ^ auVar13._4_4_;
            auVar63._8_4_ = uVar89 ^ auVar13._8_4_;
            auVar63._12_4_ = uVar90 ^ auVar13._12_4_;
            auVar63._16_4_ = uVar44;
            auVar63._20_4_ = uVar91;
            auVar63._24_4_ = uVar92;
            auVar63._28_4_ = uVar93;
            local_5bc0._0_4_ = (float)uVar28;
            local_5bc0._4_4_ = (float)((ulong)uVar28 >> 0x20);
            uStack_5bb8._0_4_ = (float)uVar29;
            uStack_5bb8._4_4_ = (float)((ulong)uVar29 >> 0x20);
            uStack_5bb0._0_4_ = (float)uVar30;
            uStack_5bb0._4_4_ = (float)((ulong)uVar30 >> 0x20);
            auVar71._0_4_ = auVar68._0_4_ * (float)local_5bc0;
            auVar71._4_4_ = auVar68._4_4_ * local_5bc0._4_4_;
            auVar71._8_4_ = auVar68._8_4_ * (float)uStack_5bb8;
            auVar71._12_4_ = auVar68._12_4_ * uStack_5bb8._4_4_;
            auVar71._16_4_ = auVar68._16_4_ * (float)uStack_5bb0;
            auVar71._20_4_ = auVar68._20_4_ * uStack_5bb0._4_4_;
            auVar71._24_4_ = auVar68._24_4_ * (float)uStack_5ba8;
            auVar71._28_4_ = 0;
            auVar66 = vcmpps_avx(auVar71,auVar63,1);
            local_5be0._0_4_ = (float)uVar31;
            local_5be0._4_4_ = (float)((ulong)uVar31 >> 0x20);
            uStack_5bd8._0_4_ = (float)uVar32;
            uStack_5bd8._4_4_ = (float)((ulong)uVar32 >> 0x20);
            uStack_5bd0._0_4_ = (float)uVar33;
            uStack_5bd0._4_4_ = (float)((ulong)uVar33 >> 0x20);
            auVar27._4_4_ = auVar68._4_4_ * local_5be0._4_4_;
            auVar27._0_4_ = auVar68._0_4_ * (float)local_5be0;
            auVar27._8_4_ = auVar68._8_4_ * (float)uStack_5bd8;
            auVar27._12_4_ = auVar68._12_4_ * uStack_5bd8._4_4_;
            auVar27._16_4_ = auVar68._16_4_ * (float)uStack_5bd0;
            auVar27._20_4_ = auVar68._20_4_ * uStack_5bd0._4_4_;
            auVar27._24_4_ = auVar68._24_4_ * (float)uStack_5bc8;
            auVar27._28_4_ = auVar68._28_4_;
            auVar68 = vcmpps_avx(auVar63,auVar27,2);
            auVar66 = vandps_avx(auVar68,auVar66);
            auVar68 = auVar67 & auVar66;
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              auVar66 = vandps_avx(auVar66,auVar67);
              auVar67 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar56),4);
              auVar68 = auVar66 & auVar67;
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0x7f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar68 >> 0xbf,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar68[0x1f]) {
              }
              else {
                auVar76 = vandps_avx(auVar67,auVar66);
              }
            }
          }
        }
      }
      uVar83 = ((local_5d10->scene->geometries).items[uVar46].ptr)->mask;
      auVar54._4_4_ = uVar83;
      auVar54._0_4_ = uVar83;
      auVar54._8_4_ = uVar83;
      auVar54._12_4_ = uVar83;
      auVar54._16_4_ = uVar83;
      auVar54._20_4_ = uVar83;
      auVar54._24_4_ = uVar83;
      auVar54._28_4_ = uVar83;
      auVar66 = vpand_avx2(auVar54,*(undefined1 (*) [32])(local_5d28 + 0x120));
      auVar67 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar66);
      auVar66 = auVar76 & ~auVar67;
      if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar66 >> 0x7f,0) != '\0') ||
            (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar66 >> 0xbf,0) != '\0') ||
          (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar66[0x1f] < '\0') {
        auVar57 = vandnps_avx(auVar67,auVar76);
        auVar57 = vandnps_avx(auVar57,auVar64);
      }
      auVar82 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      pRVar45 = (RTCIntersectArguments *)&pRVar45->feature_mask;
      local_5ce0 = auVar64;
    } while ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar57 >> 0x7f,0) != '\0') ||
               (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar57 >> 0xbf,0) != '\0') ||
             (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar57[0x1f] < '\0');
    auVar61 = ZEXT3264(local_5ca0);
    auVar66 = vandps_avx(auVar57,local_5ca0);
    lVar43 = lVar43 + 1;
    lVar48 = lVar48 + 0xb0;
    auVar57 = local_5ca0 & auVar57;
    auVar64 = local_5ca0;
    local_5ca0 = auVar66;
  } while ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar57 >> 0x7f,0) != '\0') ||
             (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar57 >> 0xbf,0) != '\0') ||
           (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar57[0x1f] < '\0');
  auVar64 = vpcmpeqd_avx2(auVar64,auVar64);
  auVar55._0_4_ = local_5ca0._0_4_ ^ auVar64._0_4_;
  auVar55._4_4_ = local_5ca0._4_4_ ^ auVar64._4_4_;
  auVar55._8_4_ = local_5ca0._8_4_ ^ auVar64._8_4_;
  auVar55._12_4_ = local_5ca0._12_4_ ^ auVar64._12_4_;
  auVar55._16_4_ = local_5ca0._16_4_ ^ auVar64._16_4_;
  auVar55._20_4_ = local_5ca0._20_4_ ^ auVar64._20_4_;
  auVar55._24_4_ = local_5ca0._24_4_ ^ auVar64._24_4_;
  auVar55._28_4_ = local_5ca0._28_4_ ^ auVar64._28_4_;
  local_5cc0 = vorps_avx(auVar55,local_5cc0);
  auVar64 = auVar64 & ~local_5cc0;
  if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar64 >> 0x7f,0) == '\0') &&
        (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar64 >> 0xbf,0) == '\0') &&
      (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar64[0x1f])
  goto LAB_01699a53;
  auVar59._8_4_ = 0xff800000;
  auVar59._0_8_ = 0xff800000ff800000;
  auVar59._12_4_ = 0xff800000;
  auVar59._16_4_ = 0xff800000;
  auVar59._20_4_ = 0xff800000;
  auVar59._24_4_ = 0xff800000;
  auVar59._28_4_ = 0xff800000;
  auVar61 = ZEXT3264(auVar59);
  local_5840 = vblendvps_avx(local_5840,auVar59,local_5cc0);
  local_5be0 = uVar31;
  uStack_5bd8 = uVar32;
  uStack_5bd0 = uVar33;
  local_5bc0 = uVar28;
  uStack_5bb8 = uVar29;
  uStack_5bb0 = uVar30;
  goto LAB_01699367;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }